

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resources.cpp
# Opt level: O2

shared_ptr<PolledShaderSource> __thiscall
Resources::getShaderSource(Resources *this,string *filename)

{
  int iVar1;
  iterator iVar2;
  PolledShaderSource *this_00;
  __shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2> *this_01;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<PolledShaderSource> sVar4;
  
  iVar1 = *(int *)&filename[2]._M_dataplus._M_p;
  *(int *)&filename[2]._M_dataplus._M_p = iVar1 + 1;
  if (iVar1 < 10) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
                    *)&filename[2]._M_string_length,in_RDX);
    if (iVar2._M_node == (_Base_ptr)&filename[2].field_2) {
      this_00 = (PolledShaderSource *)operator_new(0xd0);
      getFile((Resources *)&stack0xffffffffffffffc0,filename);
      PolledShaderSource::PolledShaderSource
                (this_00,(Resources *)filename,(shared_ptr<PolledFile> *)&stack0xffffffffffffffc0);
      std::__shared_ptr<PolledShaderSource,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<PolledShaderSource,void>
                ((__shared_ptr<PolledShaderSource,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      this_01 = &std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
                               *)&filename[2]._M_string_length,in_RDX)->
                 super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_01,(__shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2> *)this);
      _Var3._M_pi = extraout_RDX_01;
    }
    else {
      std::__shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2> *)(iVar2._M_node + 2)
                );
      _Var3._M_pi = extraout_RDX_00;
    }
  }
  else {
    aAppDebugPrintf("Include is too deep at file %s",(in_RDX->_M_dataplus)._M_p);
    (this->project_root_)._M_pathname._M_dataplus._M_p = (pointer)0x0;
    (this->project_root_)._M_pathname._M_string_length = 0;
    _Var3._M_pi = extraout_RDX;
  }
  *(int *)&filename[2]._M_dataplus._M_p = *(int *)&filename[2]._M_dataplus._M_p + -1;
  sVar4.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<PolledShaderSource>)
         sVar4.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PolledShaderSource> Resources::getShaderSource(const std::string &filename) {
	struct AutoInc {
		int &i;
		AutoInc(int &i) : i(i) { ++i; }
		~AutoInc() { --i; }
	};

	const AutoInc include_inc(shader_include_guard_);
	if (shader_include_guard_ > 10) {
		MSG("Include is too deep at file %s", filename.c_str());
		return std::shared_ptr<PolledShaderSource>();
	}

	const auto it = shader_sources_.find(filename);
	if (it != shader_sources_.end())
		return it->second;

	const std::shared_ptr<PolledShaderSource> source(
		new PolledShaderSource(*this, getFile(filename)));
	shader_sources_[filename] = source;
	return source;
}